

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void P_LineOpening(FLineOpening *open,AActor *actor,line_t *linedef,DVector2 *pos,DVector2 *ref,
                  int flags)

{
  sector_t *this;
  sector_t *this_00;
  bool bVar1;
  int iVar2;
  sector_t *psVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((flags & 4U) == 0) {
    this = linedef->backsector;
    if (this == (sector_t *)0x0) {
      open->range = 0.0;
    }
    else {
      this_00 = linedef->frontsector;
      dVar6 = 0.0;
      dVar4 = 0.0;
      dVar7 = 0.0;
      dVar5 = 0.0;
      if (((flags & 0x10U) == 0) && ((int)linedef->flags < 0)) {
        dVar4 = 3.4028234663852886e+38;
        dVar5 = 3.4028234663852886e+38;
        if ((this_00->planes[1].Flags & 0x1d0U) != 0x100) {
          dVar5 = 0.0;
        }
        if ((this->planes[1].Flags & 0x1d0U) != 0x100) {
          dVar4 = 0.0;
        }
        if ((this_00->planes[0].Flags & 0x1d0U) == 0x100) {
          dVar7 = -3.4028234663852886e+38;
        }
        if ((this->planes[0].Flags & 0x1d0U) == 0x100) {
          dVar6 = -3.4028234663852886e+38;
        }
      }
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        dVar5 = ((this_00->ceilingplane).normal.Y * pos->Y +
                (this_00->ceilingplane).normal.X * pos->X + (this_00->ceilingplane).D) *
                (this_00->ceilingplane).negiC;
      }
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        dVar4 = ((this->ceilingplane).normal.Y * pos->Y +
                (this->ceilingplane).normal.X * pos->X + (this->ceilingplane).D) *
                (this->ceilingplane).negiC;
      }
      if ((dVar7 == 0.0) && (!NAN(dVar7))) {
        dVar7 = ((this_00->floorplane).normal.Y * pos->Y +
                (this_00->floorplane).normal.X * pos->X + (this_00->floorplane).D) *
                (this_00->floorplane).negiC;
      }
      if ((dVar6 == 0.0) && (!NAN(dVar6))) {
        dVar6 = ((this->floorplane).normal.Y * pos->Y +
                (this->floorplane).normal.X * pos->X + (this->floorplane).D) *
                (this->floorplane).negiC;
      }
      psVar3 = this;
      if (dVar5 < dVar4) {
        psVar3 = this_00;
      }
      open->topsec = psVar3;
      (open->ceilingpic).texnum = psVar3->planes[1].Texture.texnum;
      if (dVar4 <= dVar5) {
        dVar5 = dVar4;
      }
      open->top = dVar5;
      if ((((ref == (DVector2 *)0x0) || ((dVar7 == -1.1754943508222875e-38 && (!NAN(dVar7))))) ||
          ((dVar6 == -1.1754943508222875e-38 && (!NAN(dVar6))))) ||
         (0.00390625 < ABS(dVar7 - dVar6))) {
        bVar1 = dVar6 < dVar7;
LAB_0051a194:
        if (!bVar1) goto LAB_0051a19c;
LAB_0051a2a7:
        open->bottom = dVar7;
        open->bottomsec = this_00;
        (open->floorpic).texnum = this_00->planes[0].Texture.texnum;
        iVar2 = sector_t::GetTerrain(this_00,0);
        open->floorterrain = iVar2;
        if ((dVar6 == -1.1754943508222875e-38) && (psVar3 = this, !NAN(dVar6)))
        goto joined_r0x0051a2e6;
LAB_0051a326:
        open->lowfloor = dVar6;
      }
      else {
        dVar5 = (this_00->floorplane).normal.X;
        if ((((dVar5 == 0.0) && (!NAN(dVar5))) &&
            (dVar5 = (this_00->floorplane).normal.Y, dVar5 == 0.0)) && (!NAN(dVar5)))
        goto LAB_0051a2a7;
        dVar5 = (this->floorplane).normal.X;
        if (((dVar5 != 0.0) || (NAN(dVar5))) ||
           ((dVar5 = (this->floorplane).normal.Y, dVar5 != 0.0 || (NAN(dVar5))))) {
          iVar2 = P_PointOnLineSide(ref,linedef);
          bVar1 = iVar2 == 0;
          goto LAB_0051a194;
        }
LAB_0051a19c:
        open->bottom = dVar6;
        open->bottomsec = this;
        (open->floorpic).texnum = this->planes[0].Texture.texnum;
        iVar2 = sector_t::GetTerrain(this,0);
        open->floorterrain = iVar2;
        dVar6 = dVar7;
        if ((dVar7 != -1.1754943508222875e-38) || (psVar3 = this_00, NAN(dVar7))) goto LAB_0051a326;
joined_r0x0051a2e6:
        if (((uint)flags >> 8 & 1) == 0) {
          dVar6 = sector_t::NextLowestFloorAt
                            (psVar3,pos->X,pos->Y,
                             sectorPortals.Array[psVar3->Portals[0]].mPlaneZ + -1.52587890625e-05,0,
                             0.0,(sector_t **)0x0,(F3DFloor **)0x0);
          goto LAB_0051a326;
        }
      }
      (open->frontfloorplane).normal.Z = (this_00->floorplane).normal.Z;
      (open->frontfloorplane).normal.Y = (this_00->floorplane).normal.Y;
      (open->frontfloorplane).normal.X = (this_00->floorplane).normal.X;
      dVar5 = (this_00->floorplane).negiC;
      (open->frontfloorplane).D = (this_00->floorplane).D;
      (open->frontfloorplane).negiC = dVar5;
      (open->backfloorplane).normal.Z = (this->floorplane).normal.Z;
      (open->backfloorplane).normal.Y = (this->floorplane).normal.Y;
      (open->backfloorplane).normal.X = (this->floorplane).normal.X;
      dVar5 = (this->floorplane).negiC;
      (open->backfloorplane).D = (this->floorplane).D;
      (open->backfloorplane).negiC = dVar5;
    }
    if (this == (sector_t *)0x0) {
      return;
    }
  }
  else {
    open->ceilingpic = -1;
    open->floorpic = -1;
    open->top = 3.4028234663852886e+38;
    open->bottomsec = (sector_t *)0x0;
    open->topsec = (sector_t *)0x0;
    open->floorterrain = -1;
    open->bottom = -3.4028234663852886e+38;
    open->lowfloor = 3.4028234663852886e+38;
    (open->frontfloorplane).normal.X = 0.0;
    (open->frontfloorplane).normal.Y = 0.0;
    (open->frontfloorplane).normal.Z = 1.0;
    (open->frontfloorplane).negiC = -1.0;
    (open->frontfloorplane).D = 3.4028234663852886e+38;
    (open->backfloorplane).normal.X = 0.0;
    (open->backfloorplane).normal.Y = 0.0;
    (open->backfloorplane).normal.Z = 1.0;
    (open->backfloorplane).negiC = -1.0;
    (open->backfloorplane).D = 3.4028234663852886e+38;
  }
  if (actor != (AActor *)0x0) {
    bVar1 = SUB41((flags & 8U) >> 3,0);
    P_LineOpening_XFloors(open,actor,linedef,pos->X,pos->Y,bVar1);
    if (((linedef->frontsector != (sector_t *)0x0) && (linedef->backsector != (sector_t *)0x0)) &&
       ((linedef->flags & 0x200000) != 0)) {
      bVar1 = P_LineOpening_3dMidtex(actor,linedef,open,bVar1);
      open->touchmidtex = bVar1;
      goto LAB_0051a3ec;
    }
  }
  open->touchmidtex = false;
  open->abovemidtex = false;
LAB_0051a3ec:
  dVar6 = open->top - open->bottom;
  dVar5 = 3.4028234663852886e+38;
  if (dVar6 <= 3.4028234663852886e+38) {
    dVar5 = dVar6;
  }
  open->range = (double)(~-(ulong)(-3.4028234663852886e+38 < dVar6) & 0xc7efffffe0000000 |
                        (ulong)dVar5 & -(ulong)(-3.4028234663852886e+38 < dVar6));
  return;
}

Assistant:

void P_LineOpening (FLineOpening &open, AActor *actor, const line_t *linedef, const DVector2 &pos, const DVector2 *ref, int flags)
{
	if (!(flags & FFCF_ONLY3DFLOORS))
	{
		sector_t *front, *back;
		double fc = 0, ff = 0, bc = 0, bf = 0;

		if (linedef->backsector == NULL)
		{
			// single sided line
			open.range = 0;
			return;
		}

		front = linedef->frontsector;
		back = linedef->backsector;

		if (!(flags & FFCF_NOPORTALS) && (linedef->flags & ML_PORTALCONNECT))
		{
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::ceiling)) fc = LINEOPEN_MAX;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::ceiling)) bc = LINEOPEN_MAX;
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::floor)) ff = LINEOPEN_MIN;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::floor)) bf = LINEOPEN_MIN;
		}

		if (fc == 0) fc = front->ceilingplane.ZatPoint(pos);
		if (bc == 0) bc = back->ceilingplane.ZatPoint(pos);
		if (ff == 0) ff = front->floorplane.ZatPoint(pos);
		if (bf == 0) bf = back->floorplane.ZatPoint(pos);


		/*Printf ("]]]]]] %d %d\n", ff, bf);*/

		open.topsec = fc < bc? front : back;
		open.ceilingpic = open.topsec->GetTexture(sector_t::ceiling);
		open.top = fc < bc ? fc : bc;

		bool usefront;

		// [RH] fudge a bit for actors that are moving across lines
		// bordering a slope/non-slope that meet on the floor. Note
		// that imprecisions in the plane equation mean there is a
		// good chance that even if a slope and non-slope look like
		// they line up, they won't be perfectly aligned.
		if (ff == -FLT_MIN || bf == -FLT_MIN || ref == NULL || fabs (ff-bf) > 1./256)
		{
			usefront = (ff > bf);
		}
		else
		{
			if (!front->floorplane.isSlope())
				usefront = true;
			else if (!back->floorplane.isSlope())
				usefront = false;
			else
				usefront = !P_PointOnLineSide (*ref, linedef);
		}

		if (usefront)
		{
			open.bottom = ff;
			open.bottomsec = front;
			open.floorpic = front->GetTexture(sector_t::floor);
			open.floorterrain = front->GetTerrain(sector_t::floor);
			if (bf != -FLT_MIN) open.lowfloor = bf;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = back->NextLowestFloorAt(pos.X, pos.Y, back->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		else
		{
			open.bottom = bf;
			open.bottomsec = back;
			open.floorpic = back->GetTexture(sector_t::floor);
			open.floorterrain = back->GetTerrain(sector_t::floor);
			if (ff != -FLT_MIN) open.lowfloor = ff;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = front->NextLowestFloorAt(pos.X, pos.Y, front->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		open.frontfloorplane = front->floorplane;
		open.backfloorplane = back->floorplane;
	}
	else
	{ // Dummy stuff to have some sort of opening for the 3D checks to modify
		open.topsec = NULL;
		open.ceilingpic.SetInvalid();
		open.top = LINEOPEN_MAX;
		open.bottomsec = NULL;
		open.floorpic.SetInvalid();
		open.floorterrain = -1;
		open.bottom = LINEOPEN_MIN;
		open.lowfloor = LINEOPEN_MAX;
		open.frontfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
		open.backfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
	}

	// Check 3D floors
	if (actor != NULL)
	{
		P_LineOpening_XFloors(open, actor, linedef, pos.X, pos.Y, !!(flags & FFCF_3DRESTRICT));
	}

	if (actor != NULL && linedef->frontsector != NULL && linedef->backsector != NULL && 
		linedef->flags & ML_3DMIDTEX)
	{
		open.touchmidtex = P_LineOpening_3dMidtex(actor, linedef, open, !!(flags & FFCF_3DRESTRICT));
	}
	else
	{
		open.abovemidtex = open.touchmidtex = false;
	}

	// avoid overflows in the opening.
	open.range = clamp(open.top - open.bottom, LINEOPEN_MIN, LINEOPEN_MAX);
}